

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O0

DescriptorFlags __thiscall
Js::CrossSiteObject<Js::FunctionWithComputedName<Js::AsmJsScriptFunction>_>::GetSetter
          (CrossSiteObject<Js::FunctionWithComputedName<Js::AsmJsScriptFunction>_> *this,
          PropertyId propertyId,Var *setterValue,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  DescriptorFlags DVar1;
  Var pvVar2;
  DescriptorFlags flags;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  PropertyId propertyId_local;
  CrossSiteObject<Js::FunctionWithComputedName<Js::AsmJsScriptFunction>_> *this_local;
  
  DVar1 = JavascriptFunction::GetSetter
                    ((JavascriptFunction *)this,propertyId,setterValue,info,requestContext);
  if (((DVar1 & Accessor) == Accessor) && (*setterValue != (Var)0x0)) {
    PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
    pvVar2 = CrossSite::MarshalVar(requestContext,*setterValue,false);
    *setterValue = pvVar2;
  }
  return DVar1;
}

Assistant:

DescriptorFlags CrossSiteObject<T>::GetSetter(PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        DescriptorFlags flags = __super::GetSetter(propertyId, setterValue, info, requestContext);
        if ((flags & Accessor) == Accessor && *setterValue)
        {
            PropertyValueInfo::SetNoCache(info, this);
            *setterValue = CrossSite::MarshalVar(requestContext, *setterValue);
        }
        return flags;
    }